

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_order.c
# Opt level: O1

void rhash_swap_copy_str_to_u64(void *to,int index,void *from,size_t length)

{
  undefined1 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  long lVar5;
  ulong *puVar6;
  
  uVar2 = (ulong)index;
  if (((index | (uint)length | (uint)to | (uint)from) & 7) == 0) {
    if (0 < (long)length) {
      puVar4 = (ulong *)(length + (long)from);
      puVar6 = (ulong *)((long)to + uVar2);
      do {
        uVar2 = *from;
        from = (void *)((long)from + 8);
        *puVar6 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                  (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                  (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28
                  | uVar2 << 0x38;
        puVar6 = puVar6 + 1;
      } while (from < puVar4);
    }
  }
  else {
    uVar3 = length + uVar2;
    if (uVar2 < uVar3) {
      lVar5 = uVar2 << 0x20;
      do {
        uVar1 = *from;
        from = (void *)((long)from + 1);
        *(undefined1 *)((long)to + (lVar5 >> 0x20 ^ 7U)) = uVar1;
        uVar2 = uVar2 + 1;
        lVar5 = lVar5 + 0x100000000;
      } while (uVar2 < uVar3);
    }
  }
  return;
}

Assistant:

void rhash_swap_copy_str_to_u64(void* to, int index, const void* from, size_t length)
{
	/* if all pointers and length are 64-bits aligned */
	if ( 0 == (( (int)((char*)to - (char*)0) | ((char*)from - (char*)0) | index | length ) & 7) ) {
		/* copy aligned memory block as 64-bit integers */
		const uint64_t* src = (const uint64_t*)from;
		const uint64_t* end = (const uint64_t*)((const char*)src + length);
		uint64_t* dst = (uint64_t*)((char*)to + index);
		while (src < end) *(dst++) = bswap_64( *(src++) );
	} else {
		const char* src = (const char*)from;
		for (length += index; (size_t)index < length; index++) ((char*)to)[index ^ 7] = *(src++);
	}
}